

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::table<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  _Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *this;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *p_Var3;
  undefined1 *puVar4;
  size_t sVar5;
  TableType type_00;
  bool bVar6;
  _Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *p_Var7;
  undefined4 *puVar8;
  _Alloc_hider _Var9;
  ImportNames *import_00;
  uint64_t uVar10;
  ImportNames *exports_00;
  Type TVar11;
  unsigned_long uVar12;
  Name name;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  undefined1 local_1f0 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8;
  string local_188;
  string local_168;
  unsigned_long local_148;
  uint64_t uStack_140;
  unsigned_long local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  size_t local_128;
  undefined1 local_120 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  optional<unsigned_int> elems;
  size_t local_e8;
  undefined1 local_e0 [8];
  MaybeResult<wasm::Ok> type;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined3 local_98;
  undefined1 uStack_95;
  undefined3 uStack_94;
  unsigned_long local_90;
  undefined1 local_88 [8];
  Result<wasm::WATParser::TableType> _val_3;
  MaybeResult<wasm::Ok> _val_2;
  
  sVar5 = (ctx->in).pos;
  expected._M_str = "table";
  expected._M_len = 5;
  bVar6 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar6) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_1f0,&ctx->in);
  if (exports.val.
      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._M_first._M_storage.
      _M_storage[8] == '\0') {
    elems.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
    local_e8 = 0;
  }
  else {
    elems.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)
         exports.val.
         super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
         super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._0_8_;
    local_e8 = (size_t)local_1f0;
  }
  local_128 = sVar5;
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_1f0,&ctx->in)
  ;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_120,
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_1f0);
  if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u._24_1_
      == '\x01') {
    puVar4 = (undefined1 *)
             ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
    local_e0 = (undefined1  [8])puVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,local_120,
               import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               _M_u._M_first._M_storage.mod.super_IString.str._M_len + (long)local_120);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (local_e0 == (undefined1  [8])puVar4) {
      *puVar1 = type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_e0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_120);
    goto LAB_00b82370;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_120);
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_120,&ctx->in);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)local_e0
             ,(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
              local_120);
  if (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    puVar4 = (undefined1 *)
             ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
    _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),
               local_e0,(undefined1 *)
                        (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                        (long)local_e0));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar4) {
      *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                         _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                    _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_e0);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_e0);
    TVar11.id = 3;
    expected_00._M_str = "i64";
    expected_00._M_len = 3;
    bVar6 = Lexer::takeKeyword(&ctx->in,expected_00);
    if (!bVar6) {
      TVar11.id = 2;
      expected_01._M_str = "i32";
      expected_01._M_len = 3;
      Lexer::takeKeyword(&ctx->in,expected_01);
    }
    maybeReftype<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_e0,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_e0);
    if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      TVar11.id = (long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 8;
      local_88 = (undefined1  [8])TVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,
                 _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_,
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                 _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_);
      puVar2 = (uint64_t *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(uint64_t **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      if (local_88 == (undefined1  [8])TVar11.id) {
        *puVar2 = _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
                  _M_storage.limits.initial;
        *(_Storage<unsigned_long,_true> *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
             _M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
        *(uint64_t *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
             _M_storage.limits.initial;
      }
      ((Type *)((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->id =
           (uintptr_t)
           _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
           _M_storage.addressType.id;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
LAB_00b81eed:
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.
                                super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20
                        ));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.
                                super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20
                        ));
      import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._36_1_ = 0;
      _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._39_1_ =
           type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_;
      if (type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
        tabletypeContinued<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::WATParser::TableType> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20),ctx
                   ,TVar11);
        this = (_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err> *)local_88,
                        (_Copy_ctor_base<false,_wasm::WATParser::TableType,_wasm::Err> *)this);
        if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
            _M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged == true) {
          type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = &local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                     local_88,(undefined1 *)
                              ((long)_val_3.val.
                                     super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                     .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                     ._M_u._M_first._M_storage.addressType.id + (long)local_88));
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          if ((undefined8 *)
              type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ == &local_a8) {
            *puVar1 = local_a8;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_a0;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                 local_a8;
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_b0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            local_88);
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            ((long)&_val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                            0x20));
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)
                            local_88);
          uVar12 = _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
          p_Var7 = (_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err> *)0x0;
          if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
            p_Var7 = this;
          }
          uVar10 = (p_Var7->_M_u)._M_first._M_storage.limits.initial;
          local_90 = (p_Var7->_M_u)._M_first._M_storage.limits.max.
                     super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload._M_value;
          _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index =
               *(__index_type *)((long)&p_Var7->_M_u + 0x18);
          puVar8 = (undefined4 *)&DAT_00000019;
          if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
            puVar8 = (undefined4 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x11);
          }
          local_98 = (undefined3)*puVar8;
          uStack_95 = (undefined1)*(undefined4 *)((long)puVar8 + 3);
          uStack_94 = (undefined3)((uint)*(undefined4 *)((long)puVar8 + 3) >> 8);
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TableType,_wasm::Err>::
          ~_Variant_storage(this);
LAB_00b81fb0:
          bVar6 = Lexer::takeRParen(&ctx->in);
          if (bVar6) {
            exports_00 = (ImportNames *)local_1f0;
            if (exports.val.
                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_ != '\0'
               ) {
              exports_00 = (ImportNames *)0x0;
            }
            import_00 = (ImportNames *)local_120;
            if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                _M_u._24_1_ != '\0') {
              import_00 = (ImportNames *)0x0;
            }
            local_138 = local_90;
            uStack_12c = CONCAT31(uStack_94,uStack_95);
            uStack_130._1_3_ = (undefined3)_local_98;
            uStack_130 = CONCAT31(uStack_130._1_3_,
                                  _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  _M_index);
            type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._12_4_ = uStack_12c;
            type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_4_ = uStack_130;
            type_00.limits.initial = uVar10;
            type_00.addressType.id = uVar12;
            type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_90;
            name.super_IString.str._M_str =
                 (char *)elems.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>;
            name.super_IString.str._M_len = local_e8;
            local_148 = uVar12;
            uStack_140 = uVar10;
            ParseDeclsCtx::addTable
                      ((Result<wasm::Ok> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                       ,ctx,name,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)exports_00,
                       import_00,type_00,(Index)local_128);
            if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01')
            {
              local_88 = (undefined1  [8])
                         ((long)&_val_3.val.
                                 super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_88,
                         _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_,
                         _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                         _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_)
              ;
LAB_00b82081:
              puVar2 = (uint64_t *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
              ;
              *(uint64_t **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
              if (local_88 ==
                  (undefined1  [8])
                  ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 8U)) {
                *puVar2 = _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                          _M_first._M_storage.limits.initial;
                *(_Storage<unsigned_long,_true> *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                     _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                     _M_first._M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>.
                     _M_payload.super__Optional_payload_base<unsigned_long>._M_payload;
              }
              else {
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
                *(uint64_t *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                     _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                     _M_first._M_storage.limits.initial;
              }
              ((Type *)((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->
              id = (uintptr_t)
                   _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first
                   ._M_storage.addressType.id;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&_val_3.val.
                                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                + 0x20));
            }
            else {
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&_val_3.val.
                                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                + 0x20));
              if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._39_1_ != '\x01') {
                ParseDeclsCtx::addImplicitElems
                          ((__index_type *)
                           ((long)&_val_3.val.
                                   super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                           0x20),ctx,
                           (__index_type *)
                           ((long)&import.val.
                                   super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           + 0x20));
                if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                    '\x01') {
                  local_88 = (undefined1  [8])
                             ((long)&_val_3.val.
                                     super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                     .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                             8);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_88,
                             _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>.
                             _32_8_,_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    _M_u._0_8_ +
                                    _val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                    ._32_8_);
                  goto LAB_00b82081;
                }
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                  ((long)&_val_3.val.
                                          super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                  + 0x20));
              }
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
            }
          }
          else {
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_168,"expected end of table declaration","");
            Lexer::err((Err *)((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20),&ctx->in,&local_168);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            puVar4 = (undefined1 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
            if ((undefined1 *)
                _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar4
               ) {
              *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                                 _9_7_,_val_2.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._9_7_,
                                     _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._8_1_);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            local_1b8._M_allocated_capacity = local_168.field_2._M_allocated_capacity;
            _Var9._M_p = local_168._M_dataplus._M_p;
            _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_00b822db;
          }
        }
      }
      else {
        expected_02._M_str = "elem";
        expected_02._M_len = 4;
        bVar6 = Lexer::takeSExprStart(&ctx->in,expected_02);
        if (bVar6) {
          if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u
              ._24_1_ == '\x01') {
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\0';
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._33_3_ = 0;
            p_Var3 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20);
            bVar6 = false;
            local_90 = TVar11.id;
            while (maybeElemexpr<wasm::WATParser::ParseDeclsCtx>
                             ((MaybeResult<wasm::Ok> *)p_Var3,ctx),
                  _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                  '\x01') {
              std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88,
                              (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)p_Var3);
              if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u._M_first.
                  _M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged == true) {
                type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = &local_a8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)
                           ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                           local_88,(undefined1 *)
                                    ((long)_val_3.val.
                                           super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                           ._M_u._M_first._M_storage.addressType.id + (long)local_88
                                    ));
                goto LAB_00b82444;
              }
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88
                               );
              _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ =
                   _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ + 1;
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage(p_Var3);
              bVar6 = true;
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              ((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20));
            uVar12 = local_90;
            if (!bVar6) {
              p_Var3 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
              ;
LAB_00b8230e:
              maybeFuncidx<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)p_Var3,ctx);
              if (_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                  '\x01') {
                std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88,
                                (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)p_Var3);
                if (_val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._M_u.
                    _M_first._M_storage.limits.max.super__Optional_base<unsigned_long,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged != true)
                goto code_r0x00b82335;
                type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = &local_a8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)
                           ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                           local_88,(undefined1 *)
                                    ((long)_val_3.val.
                                           super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                           .
                                           super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>
                                           ._M_u._M_first._M_storage.addressType.id + (long)local_88
                                    ));
LAB_00b82444:
                puVar1 = (undefined8 *)
                         ((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                         0x10);
                *(undefined8 **)
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
                if ((undefined8 *)
                    type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ ==
                    &local_a8) {
                  *puVar1 = local_a8;
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                       uStack_a0;
                }
                else {
                  *(undefined8 *)
                   &(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                       type.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                       local_a8;
                }
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                     local_b0;
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                     '\x02';
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                  local_88);
                goto LAB_00b81eed;
              }
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                ((long)&_val_3.val.
                                        super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                + 0x20));
            }
            bVar6 = Lexer::takeRParen(&ctx->in);
            if (bVar6) {
              uVar10 = (uint64_t)
                       (uint)_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_;
              import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              _32_8_ = uVar10 | 0x100000000;
              _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x01';
              local_90 = uVar10;
              goto LAB_00b81fb0;
            }
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"expected end of inline elems","");
            Lexer::err((Err *)((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20),&ctx->in,&local_188);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            puVar4 = (undefined1 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
            if ((undefined1 *)
                _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar4
               ) {
              *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                                 _9_7_,_val_2.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._9_7_,
                                     _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._8_1_);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            local_1b8._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
            _Var9._M_p = local_188._M_dataplus._M_p;
            _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_00b822db;
          }
          else {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a8,"imported tables cannot have inline elements","");
            Lexer::err((Err *)((long)&_val_3.val.
                                      super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                      .super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                              + 0x20),&ctx->in,&local_1a8);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            puVar4 = (undefined1 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
            if ((undefined1 *)
                _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar4
               ) {
              *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                                 _9_7_,_val_2.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._9_7_,
                                     _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._8_1_);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            local_1b8._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
            _Var9._M_p = local_1a8._M_dataplus._M_p;
            _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_00b822db;
          }
        }
        else {
          exports.val.
          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ = &local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                     "expected table limits or inline elements","");
          Lexer::err((Err *)((long)&_val_3.val.
                                    super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                            0x20),&ctx->in,
                     (string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          puVar4 = (undefined1 *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
          if ((undefined1 *)
              _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ == puVar4)
          {
            *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                               _9_7_,_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     _M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_
                            ,_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u.
                             _8_1_);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
               _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
          _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
          _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          _Var9._M_p = (pointer)exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>.
                                _32_8_;
          _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ = puVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)exports.val.
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ !=
              &local_1b8) {
LAB_00b822db:
            _val_3.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_ =
                 (long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
            _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
            operator_delete(_Var9._M_p,local_1b8._M_allocated_capacity + 1);
          }
        }
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_e0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             local_120);
LAB_00b82370:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_1f0);
  return __return_storage_ptr__;
code_r0x00b82335:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
  _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ =
       _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ + 1;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage(p_Var3);
  goto LAB_00b8230e;
}

Assistant:

MaybeResult<> table(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("table"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  // Reftype if we have inline elements.
  auto type = maybeReftype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::TableTypeT> ttype;
  std::optional<typename Ctx::ElemListT> elems;
  if (type) {
    // We should have inline elements.
    if (!ctx.in.takeSExprStart("elem"sv)) {
      return ctx.in.err("expected table limits or inline elements");
    }
    if (import) {
      return ctx.in.err("imported tables cannot have inline elements");
    }

    auto list = ctx.makeElemList(*type);
    bool foundElem = false;
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(list, *elem);
      foundElem = true;
    }

    // If there were no elemexprs, then maybe we have funcidxs instead.
    if (!foundElem) {
      while (auto func = maybeFuncidx(ctx)) {
        CHECK_ERR(func);
        ctx.appendFuncElem(list, *func);
      }
    }

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline elems");
    }
    ttype = ctx.makeTableType(addressType, ctx.getLimitsFromElems(list), *type);
    elems = std::move(list);
  } else {
    auto tabtype = tabletypeContinued(ctx, addressType);
    CHECK_ERR(tabtype);
    ttype = *tabtype;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of table declaration");
  }

  CHECK_ERR(ctx.addTable(name, *exports, import.getPtr(), *ttype, pos));

  if (elems) {
    CHECK_ERR(ctx.addImplicitElems(*type, std::move(*elems)));
  }

  return Ok{};
}